

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O3

void ymf278b_C_w(YMF278BChip *chip,UINT8 reg,UINT8 data)

{
  byte *pbVar1;
  UINT8 UVar2;
  undefined4 uVar3;
  byte bVar4;
  uint uVar5;
  UINT32 UVar6;
  uint uVar7;
  char cVar8;
  uint uVar9;
  long lVar10;
  undefined7 in_register_00000031;
  YMF278BSlot *slot;
  byte bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  
  slot = (YMF278BSlot *)CONCAT71(in_register_00000031,reg);
  uVar5 = (int)slot - 8;
  bVar4 = (byte)uVar5;
  if (0xef < bVar4) {
    if (reg < 6) {
      if (reg == '\x03') {
        data = data & 0x3f;
      }
      else if (reg == '\x05') {
        chip->memadr = (uint)data | (uint)chip->regs[3] << 0x10 | (uint)chip->regs[4] << 8;
      }
    }
    else if (reg == '\x06') {
      if ((chip->regs[2] & 1) != 0) {
        uVar5 = chip->memadr;
        if (chip->ROMSize <= (uVar5 & 0x3fffff)) {
          UVar6 = ymf278b_getRamAddress(chip,(uVar5 & 0x3fffff) - chip->ROMSize);
          if (UVar6 < chip->RAMSize) {
            chip->ram[UVar6] = data;
            uVar5 = chip->memadr;
          }
        }
        chip->memadr = uVar5 + 1;
      }
    }
    else if (reg == 0xf8) {
      chip->fm_l = data & 7;
      chip->fm_r = data >> 3 & 7;
      refresh_opl3_volume(chip);
    }
    else if (reg == 0xf9) {
      chip->pcm_l = data & 7;
      chip->pcm_r = data >> 3 & 7;
    }
    goto LAB_00155ad1;
  }
  uVar5 = uVar5 & 0xff;
  bVar4 = bVar4 + (char)(uVar5 / 0x18) * -0x18;
  switch(uVar5) {
  default:
    uVar7 = (uint)data | chip->slots[bVar4].wave & 0x100;
    chip->slots[bVar4].wave = (UINT16)uVar7;
    if ((uVar7 < 0x180) || (uVar9 = chip->regs[2] >> 2 & 7, (char)uVar9 == '\0')) {
      uVar7 = uVar7 * 0xc;
    }
    else {
      uVar7 = (uVar7 * 0xc + uVar9 * 0x80000) - 0x1200;
    }
    lVar10 = 0x528;
    if (uVar7 < chip->ROMSize) {
LAB_00155a0f:
      lVar10 = *(long *)((long)chip->slots + lVar10 + -0x20);
      if (lVar10 != 0) {
        pbVar1 = (byte *)(lVar10 + (ulong)uVar7);
        chip->slots[bVar4].bits = *pbVar1 >> 6;
        *(uint *)&(((YMF278BChip *)(chip->slots + bVar4))->_devData).chipInf =
             (*pbVar1 & 0x3f) << 0x10 |
             (uint)(ushort)(*(ushort *)(pbVar1 + 1) << 8 | *(ushort *)(pbVar1 + 1) >> 8);
        chip->slots[bVar4].loopaddr = *(ushort *)(pbVar1 + 3) << 8 | *(ushort *)(pbVar1 + 3) >> 8;
        chip->slots[bVar4].endaddr = *(ushort *)(pbVar1 + 5) << 8 | *(ushort *)(pbVar1 + 5) >> 8;
        bVar11 = reg + ((byte)(uVar5 / 3) & 0xf8) * -3 + 0x78;
        lVar10 = 0;
        do {
          slot = (YMF278BSlot *)(ulong)bVar11;
          ymf278b_C_w(chip,bVar11,pbVar1[lVar10 + 7]);
          bVar11 = bVar11 + 0x18;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 5);
        if (chip->slots[bVar4].keyon == '\0') {
          chip->slots[bVar4].stepptr = 0;
          chip->slots[bVar4].pos = 0;
          break;
        }
        goto LAB_00155acc;
      }
    }
    else {
      uVar7 = ymf278b_getRamAddress(chip,uVar7 - chip->ROMSize);
      if (uVar7 < chip->RAMSize) {
        lVar10 = 0x538;
        goto LAB_00155a0f;
      }
    }
    chip->slots[bVar4].bits = 0xff;
    break;
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    uVar5._0_2_ = chip->slots[bVar4].wave;
    uVar5._2_2_ = chip->slots[bVar4].FN;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = (ulong)((data & 1) << 8) | (ulong)(data >> 1) << 0x10;
    auVar13 = auVar13 | ZEXT416(uVar5) & _DAT_0017a880;
    uVar3 = auVar13._0_4_;
    chip->slots[bVar4].wave = (short)uVar3;
    chip->slots[bVar4].FN = (short)((uint)uVar3 >> 0x10);
    cVar8 = chip->slots[bVar4].OCT;
    uVar5 = 0;
    if (cVar8 != -8) {
      uVar5 = ((auVar13._2_2_ | 0x400) << (cVar8 + 8U & 0x1f)) >> 3;
    }
    chip->slots[bVar4].step = uVar5;
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
    uVar5 = (data & 7) << 7 | chip->slots[bVar4].FN & 0x7f;
    chip->slots[bVar4].FN = (UINT16)uVar5;
    chip->slots[bVar4].PRVB = data >> 3 & 1;
    cVar8 = (char)data >> 4;
    chip->slots[bVar4].OCT = cVar8;
    uVar7 = 0;
    if (cVar8 != -8) {
      uVar7 = ((uVar5 | 0x400) << (cVar8 + 8U & 0x1f)) >> 3;
    }
    chip->slots[bVar4].step = uVar7;
    break;
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
    bVar11 = 0xff;
    if (data >> 1 != 0x7f) {
      bVar11 = data >> 1;
    }
    chip->slots[bVar4].TLdest = bVar11;
    chip->slots[bVar4].LD = data & 1;
    if ((data & 1) != 0) {
      chip->slots[bVar4].TL = bVar11;
    }
    break;
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
    bVar11 = 8;
    if ((data & 0x10) == 0) {
      bVar11 = data & 0xf;
    }
    chip->slots[bVar4].pan = bVar11;
    bVar12 = (data & 0x20) == 0;
    if (!bVar12) {
      chip->slots[bVar4].lfo_cnt = 0;
    }
    chip->slots[bVar4].lfo_active = bVar12;
    chip->slots[bVar4].DAMP = data >> 6 & 1;
    UVar2 = chip->slots[bVar4].keyon;
    if (-1 < (char)data) {
      if (UVar2 != '\0') {
        chip->slots[bVar4].keyon = '\0';
        chip->slots[bVar4].state = '\x01';
      }
      break;
    }
    if (UVar2 != '\0') break;
    chip->slots[bVar4].keyon = '\x01';
LAB_00155acc:
    ymf278b_keyOnHelper((YMF278BChip *)(chip->slots + bVar4),slot);
    break;
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case 0x7d:
  case 0x7e:
  case 0x7f:
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
    chip->slots[bVar4].lfo = data >> 3 & 7;
    chip->slots[bVar4].vib = data & 7;
    break;
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
  case 0xa0:
  case 0xa1:
  case 0xa2:
  case 0xa3:
  case 0xa4:
  case 0xa5:
  case 0xa6:
  case 0xa7:
    chip->slots[bVar4].AR = data >> 4;
    chip->slots[bVar4].D1R = data & 0xf;
    break;
  case 0xa8:
  case 0xa9:
  case 0xaa:
  case 0xab:
  case 0xac:
  case 0xad:
  case 0xae:
  case 0xaf:
  case 0xb0:
  case 0xb1:
  case 0xb2:
  case 0xb3:
  case 0xb4:
  case 0xb5:
  case 0xb6:
  case 0xb7:
  case 0xb8:
  case 0xb9:
  case 0xba:
  case 0xbb:
  case 0xbc:
  case 0xbd:
  case 0xbe:
  case 0xbf:
    chip->slots[bVar4].DL = dl_tab[data >> 4];
    chip->slots[bVar4].D2R = data & 0xf;
    break;
  case 0xc0:
  case 0xc1:
  case 0xc2:
  case 0xc3:
  case 0xc4:
  case 0xc5:
  case 0xc6:
  case 199:
  case 200:
  case 0xc9:
  case 0xca:
  case 0xcb:
  case 0xcc:
  case 0xcd:
  case 0xce:
  case 0xcf:
  case 0xd0:
  case 0xd1:
  case 0xd2:
  case 0xd3:
  case 0xd4:
  case 0xd5:
  case 0xd6:
  case 0xd7:
    chip->slots[bVar4].RC = data >> 4;
    chip->slots[bVar4].RR = data & 0xf;
    break;
  case 0xd8:
  case 0xd9:
  case 0xda:
  case 0xdb:
  case 0xdc:
  case 0xdd:
  case 0xde:
  case 0xdf:
  case 0xe0:
  case 0xe1:
  case 0xe2:
  case 0xe3:
  case 0xe4:
  case 0xe5:
  case 0xe6:
  case 0xe7:
  case 0xe8:
  case 0xe9:
  case 0xea:
  case 0xeb:
  case 0xec:
  case 0xed:
  case 0xee:
  case 0xef:
    chip->slots[bVar4].AM = data & 7;
  }
LAB_00155ad1:
  chip->regs[reg] = data;
  return;
}

Assistant:

static void ymf278b_C_w(YMF278BChip* chip, UINT8 reg, UINT8 data)
{
	// Handle slot registers specifically
	if (reg >= 0x08 && reg <= 0xF7)
	{
		int snum = (reg - 8) % 24;
		YMF278BSlot* slot = &chip->slots[snum];
		UINT8 wavetblhdr;
		UINT32 base;
		UINT8* buf;
		int i;
		
		switch((reg - 8) / 24)
		{
		case 0:
			slot->wave = (slot->wave & 0x100) | data;
			wavetblhdr = (chip->regs[2] >> 2) & 0x7;
			base = (slot->wave < 384 || ! wavetblhdr) ?
			       (slot->wave * 12) :
			       (wavetblhdr * 0x80000 + ((slot->wave - 384) * 12));
			// TODO What if R#2 bit 0 = 1?
			//      See also getSample()
			buf = ymf278b_getMemPtr(chip, base);
			if (buf == NULL)
			{
				slot->bits = ~0;	// set invalid value to mute the sample
				break;
			}
			
			slot->bits = (buf[0] & 0xC0) >> 6;
			slot->startaddr = buf[2] | (buf[1] << 8) | ((buf[0] & 0x3F) << 16);
			slot->loopaddr = buf[4] | (buf[3] << 8);
			slot->endaddr  = buf[6] | (buf[5] << 8);
			for (i = 7; i < 12; ++i)
			{
				// Verified on real YMF278:
				// After tone loading, if you read these
				// registers, their value actually has changed.
				ymf278b_C_w(chip, 8 + snum + (i - 2) * 24, buf[i]);
			}
			
			if (slot->keyon) {
				ymf278b_keyOnHelper(chip, slot);
			} else {
				slot->stepptr = 0;
				slot->pos = 0;
			}
			break;
		case 1:
			slot->wave = (slot->wave & 0xFF) | ((data & 0x1) << 8);
			slot->FN = (slot->FN & 0x380) | (data >> 1);
			slot->step = calcStep(slot->OCT, slot->FN, 0);
			break;
		case 2:
			slot->FN = (slot->FN & 0x07F) | ((data & 0x07) << 7);
			slot->PRVB = ((data & 0x08) >> 3);
			slot->OCT =  sign_extend_4((data & 0xF0) >> 4);
			slot->step = calcStep(slot->OCT, slot->FN, 0);
			break;
		case 3:
			slot->TLdest = data >> 1;
			if (slot->TLdest == 0x7F)
				slot->TLdest = 0xFF;	// verified on HW via volume interpolation
			slot->LD = data & 0x1;

			if (slot->LD) {
				// directly change volume
				slot->TL = slot->TLdest;
			} else {
				// interpolate volume
			}
			break;
		case 4:
			if (data & 0x10)
			{
				// output to DO1 pin:
				// this pin is not used in moonsound
				// we emulate this by muting the sound
				slot->pan = 8; // both left/right -inf dB
			}
			else
				slot->pan = data & 0x0F;

			if (data & 0x20)
			{
				// LFO reset
				slot->lfo_active = 0;
				slot->lfo_cnt = 0;
			}
			else
			{
				// LFO activate
				slot->lfo_active = 1;
			}

			slot->DAMP = (data & 0x40) >> 6;
			if (data & 0x80)
			{
				if (! slot->keyon)
				{
					slot->keyon = 1;
					ymf278b_keyOnHelper(chip, slot);
				}
			}
			else
			{
				if (slot->keyon)
				{
					slot->keyon = 0;
					slot->state = EG_REL;
				}
			}
			break;
		case 5:
			slot->lfo = (data >> 3) & 0x7;
			slot->vib = data & 0x7;
			break;
		case 6:
			slot->AR  = data >> 4;
			slot->D1R = data & 0xF;
			break;
		case 7:
			slot->DL  = dl_tab[data >> 4];
			slot->D2R = data & 0xF;
			break;
		case 8:
			slot->RC = data >> 4;
			slot->RR = data & 0xF;
			break;
		case 9:
			slot->AM = data & 0x7;
			break;
		}
	}
	else
	{
		// All non-slot registers
		switch (reg)
		{
		case 0x00: // TEST
		case 0x01:
			break;

		case 0x02:
			// wave-table-header / memory-type / memory-access-mode
			// Simply store in regs[2]
			break;

		case 0x03:
			// Verified on real YMF278:
			// * Don't update the 'memadr' variable on writes to
			//   reg 3 and 4. Only store the value in the 'regs'
			//   array for later use.
			// * The upper 2 bits are not used to address the
			//   external memories (so from a HW pov they don't
			//   matter). But if you read back this register, the
			//   upper 2 bits always read as '0' (even if you wrote
			//   '1'). So we mask the bits here already.
			data &= 0x3F;
			break;

		case 0x04:
			// See reg 3.
			break;

		case 0x05:
			// Verified on real YMF278: (see above)
			// Only writes to reg 5 change the (full) 'memadr'.
			chip->memadr = (chip->regs[3] << 16) | (chip->regs[4] << 8) | data;
			break;

		case 0x06:  // memory data
			if (chip->regs[2] & 1) {
				ymf278b_writeMem(chip, chip->memadr, data);
				++chip->memadr; // no need to mask (again) here
			} else {
				// Verified on real YMF278:
				//  - writes are ignored
				//  - memadr is NOT increased
			}
			break;

		case 0xF8:
			chip->fm_l = data & 0x7;
			chip->fm_r = (data >> 3) & 0x7;
			refresh_opl3_volume(chip);
			break;

		case 0xF9:
			chip->pcm_l = data & 0x7;
			chip->pcm_r = (data >> 3) & 0x7;
			break;
		}
	}

	chip->regs[reg] = data;
}